

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveFieldLiteGenerator::GenerateKotlinDslMembers
          (ImmutablePrimitiveFieldLiteGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  FieldDescriptor *this_00;
  long lVar1;
  Descriptor *pDVar2;
  
  WriteFieldDocComment(printer,this->descriptor_);
  variables = &this->variables_;
  io::Printer::Print(printer,variables,
                     "$kt_deprecation$public var $kt_name$: $kt_type$\n  @JvmName(\"${$get$kt_capitalized_name$$}$\")\n  get() = $kt_dsl_builder$.${$get$capitalized_name$$}$()\n  @JvmName(\"${$set$kt_capitalized_name$$}$\")\n  set(value) {\n    $kt_dsl_builder$.${$set$capitalized_name$$}$(value)\n  }\n"
                    );
  WriteFieldAccessorDocComment(printer,this->descriptor_,CLEARER,false);
  io::Printer::Print(printer,variables,
                     "public fun ${$clear$kt_capitalized_name$$}$() {\n  $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n}\n"
                    );
  this_00 = this->descriptor_;
  if (((~(byte)this_00[1] & 0x60) != 0) &&
     ((((pDVar2 = FieldDescriptor::message_type(this_00), pDVar2 != (Descriptor *)0x0 ||
        (((byte)this_00[1] & 2) != 0)) || (*(char *)(*(long *)(this_00 + 0x10) + 0x3a) == '\x02'))
      || ((lVar1 = *(long *)(this_00 + 0x28), lVar1 != 0 && ((byte)this_00[1] & 0x10) != 0 &&
          ((*(int *)(lVar1 + 4) != 1 || ((*(byte *)(*(long *)(lVar1 + 0x20) + 1) & 2) == 0)))))))) {
    WriteFieldAccessorDocComment(printer,this->descriptor_,HAZZER,false);
    io::Printer::Print(printer,variables,
                       "public fun ${$has$kt_capitalized_name$$}$(): kotlin.Boolean {\n  return $kt_dsl_builder$.${$has$capitalized_name$$}$()\n}\n"
                      );
    return;
  }
  return;
}

Assistant:

void ImmutablePrimitiveFieldLiteGenerator::GenerateKotlinDslMembers(
    io::Printer* printer) const {
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
                 "$kt_deprecation$public var $kt_name$: $kt_type$\n"
                 "  @JvmName(\"${$get$kt_capitalized_name$$}$\")\n"
                 "  get() = $kt_dsl_builder$.${$get$capitalized_name$$}$()\n"
                 "  @JvmName(\"${$set$kt_capitalized_name$$}$\")\n"
                 "  set(value) {\n"
                 "    $kt_dsl_builder$.${$set$capitalized_name$$}$(value)\n"
                 "  }\n");

  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               /* builder */ false);
  printer->Print(variables_,
                 "public fun ${$clear$kt_capitalized_name$$}$() {\n"
                 "  $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n"
                 "}\n");

  if (HasHazzer(descriptor_)) {
    WriteFieldAccessorDocComment(printer, descriptor_, HAZZER);
    printer->Print(
        variables_,
        "public fun ${$has$kt_capitalized_name$$}$(): kotlin.Boolean {\n"
        "  return $kt_dsl_builder$.${$has$capitalized_name$$}$()\n"
        "}\n");
  }
}